

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_and_time.c
# Opt level: O2

void * lyplg_type_print_date_and_time
                 (ly_ctx *ctx,lyd_value *value,LY_VALUE_FORMAT format,void *UNUSED_prefix_data,
                 ly_bool *dynamic,size_t *value_len)

{
  anon_union_24_16_e2776397_for_lyd_value_2 *__timer;
  int iVar1;
  LY_ERR LVar2;
  int64_t *piVar3;
  size_t sVar4;
  size_t sVar5;
  tm *ptVar6;
  char *pcVar7;
  char *pcVar8;
  char *ret;
  ulong local_70;
  tm tm;
  
  __timer = &value->field_2;
  if (format != LY_VALUE_LYB) {
    if (value->_canonical != (char *)0x0) {
LAB_001b3014:
      if (dynamic != (ly_bool *)0x0) {
        *dynamic = '\0';
      }
      pcVar7 = value->_canonical;
      if (value_len != (size_t *)0x0) {
        sVar4 = strlen(pcVar7);
        *value_len = sVar4;
        return pcVar7;
      }
      return pcVar7;
    }
    if ((value->field_2).fixed_mem[0x10] == '\0') {
      LVar2 = ly_time_time2str((value->field_2).dec64,*(char **)((long)&value->field_2 + 8),&ret);
      if (LVar2 != LY_SUCCESS) {
        return (void *)0x0;
      }
    }
    else {
      ptVar6 = gmtime_r((time_t *)&__timer->boolean,(tm *)&tm);
      if (ptVar6 == (tm *)0x0) {
        return (void *)0x0;
      }
      local_70 = (ulong)(uint)tm.tm_min;
      pcVar7 = *(char **)((long)&value->field_2 + 8);
      pcVar8 = ".";
      if (pcVar7 == (char *)0x0) {
        pcVar8 = "";
        pcVar7 = "";
      }
      iVar1 = asprintf(&ret,"%04d-%02d-%02dT%02d:%02d:%02d%s%s-00:00",(ulong)(tm.tm_year + 0x76c),
                       (ulong)(tm.tm_mon + 1),(ulong)(uint)tm.tm_mday,(ulong)(uint)tm.tm_hour,
                       local_70,(ulong)(uint)tm.tm_sec,pcVar8,pcVar7);
      if (iVar1 == -1) {
        return (void *)0x0;
      }
    }
    LVar2 = lydict_insert_zc(ctx,ret,&value->_canonical);
    if (LVar2 == LY_SUCCESS) goto LAB_001b3014;
    goto LAB_001b316e;
  }
  pcVar7 = *(char **)((long)&value->field_2 + 8);
  if ((value->field_2).fixed_mem[0x10] == '\0') {
    if (pcVar7 == (char *)0x0) {
      *dynamic = '\0';
      if (value_len != (size_t *)0x0) {
        *value_len = 8;
        return __timer;
      }
      return __timer;
    }
LAB_001b3047:
    sVar4 = strlen(pcVar7);
    sVar4 = sVar4 + 9;
  }
  else {
    if (pcVar7 != (char *)0x0) goto LAB_001b3047;
    sVar4 = 9;
  }
  piVar3 = (int64_t *)malloc(sVar4);
  ret = (char *)piVar3;
  if (piVar3 != (int64_t *)0x0) {
    *dynamic = '\x01';
    pcVar7 = *(char **)((long)&value->field_2 + 8);
    if (value_len != (size_t *)0x0) {
      if (pcVar7 == (char *)0x0) {
        sVar5 = 9;
      }
      else {
        sVar4 = strlen(pcVar7);
        sVar5 = sVar4 + 9;
      }
      *value_len = sVar5;
    }
    *piVar3 = (value->field_2).dec64;
    *(uint8_t *)(piVar3 + 1) = (value->field_2).fixed_mem[0x10];
    if (pcVar7 != (char *)0x0) {
      sVar4 = strlen(pcVar7);
      memcpy((void *)((long)piVar3 + 9),pcVar7,sVar4);
      return piVar3;
    }
    return piVar3;
  }
LAB_001b316e:
  ly_log(ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lyplg_type_print_date_and_time");
  return (void *)0x0;
}

Assistant:

static const void *
lyplg_type_print_date_and_time(const struct ly_ctx *ctx, const struct lyd_value *value, LY_VALUE_FORMAT format,
        void *UNUSED(prefix_data), ly_bool *dynamic, size_t *value_len)
{
    struct lyd_value_date_and_time *val;
    struct tm tm;
    char *ret;

    LYD_VALUE_GET(value, val);

    if (format == LY_VALUE_LYB) {
        if (val->unknown_tz || val->fractions_s) {
            ret = malloc(8 + 1 + (val->fractions_s ? strlen(val->fractions_s) : 0));
            LY_CHECK_ERR_RET(!ret, LOGMEM(ctx), NULL);

            *dynamic = 1;
            if (value_len) {
                *value_len = 8 + 1 + (val->fractions_s ? strlen(val->fractions_s) : 0);
            }
            memcpy(ret, &val->time, sizeof val->time);
            memcpy(ret + 8, &val->unknown_tz, sizeof val->unknown_tz);
            if (val->fractions_s) {
                memcpy(ret + 9, val->fractions_s, strlen(val->fractions_s));
            }
        } else {
            *dynamic = 0;
            if (value_len) {
                *value_len = 8;
            }
            ret = (char *)&val->time;
        }
        return ret;
    }

    /* generate canonical value if not already */
    if (!value->_canonical) {
        if (val->unknown_tz) {
            /* ly_time_time2str but always using GMT */
            if (!gmtime_r(&val->time, &tm)) {
                return NULL;
            }
            if (asprintf(&ret, "%04d-%02d-%02dT%02d:%02d:%02d%s%s-00:00",
                    tm.tm_year + 1900, tm.tm_mon + 1, tm.tm_mday, tm.tm_hour, tm.tm_min, tm.tm_sec,
                    val->fractions_s ? "." : "", val->fractions_s ? val->fractions_s : "") == -1) {
                return NULL;
            }
        } else {
            if (ly_time_time2str(val->time, val->fractions_s, &ret)) {
                return NULL;
            }
        }

        /* store it */
        if (lydict_insert_zc(ctx, ret, (const char **)&value->_canonical)) {
            LOGMEM(ctx);
            return NULL;
        }
    }

    /* use the cached canonical value */
    if (dynamic) {
        *dynamic = 0;
    }
    if (value_len) {
        *value_len = strlen(value->_canonical);
    }
    return value->_canonical;
}